

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

uint * __thiscall
google::protobuf::RepeatedField<unsigned_int>::elements
          (RepeatedField<unsigned_int> *this,bool is_soo)

{
  int iVar1;
  uint *puVar2;
  undefined7 in_register_00000031;
  
  iVar1 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (0 < iVar1) {
    if (is_soo) {
      return (uint *)((long)&(this->soo_rep_).field_0 + 8);
    }
    puVar2 = (uint *)internal::LongSooRep::elements((LongSooRep *)this);
    return puVar2;
  }
  elements();
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }